

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmForEachCommand.cxx
# Opt level: O2

bool __thiscall
anon_unknown.dwarf_f3cf1e::cmForEachFunctionBlocker::Replay
          (cmForEachFunctionBlocker *this,
          vector<cmListFileFunction,_std::allocator<cmListFileFunction>_> *functions,
          cmExecutionStatus *inStatus)

{
  size_t sVar1;
  cmMakefile *pcVar2;
  pointer pbVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__first;
  pointer pcVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  cmExecutionStatus *functions_00;
  bool bVar7;
  InvokeResult IVar8;
  InvokeResult IVar9;
  PolicyStatus PVar10;
  string *psVar11;
  string *psVar12;
  size_type __new_size;
  _Rb_tree_node_base *p_Var13;
  cmMakefile *mf;
  uint i;
  ulong uVar14;
  pointer pbVar15;
  pointer pbVar16;
  pointer pcVar17;
  uint uVar18;
  ulong uVar19;
  string_view value;
  string_view value_00;
  string_view value_01;
  string_view value_02;
  vector<cmList,_std::allocator<cmList>_> values;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  iterationVars;
  ulong local_c0;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  oldDefs;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  cmExecutionStatus *local_60;
  cmForEachFunctionBlocker *local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> iter_var_prefix;
  
  sVar1 = this->IterationVarsCount;
  if (this->ZipLists == true) {
    if (sVar1 == 0) {
      __assert_fail("\"Unexpected number of iteration variables\" && this->IterationVarsCount >= 1",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/cmForEachCommand.cxx"
                    ,0x9b,
                    "bool (anonymous namespace)::cmForEachFunctionBlocker::ReplayZipLists(const std::vector<cmListFileFunction> &, cmExecutionStatus &)"
                   );
    }
    pcVar2 = inStatus->Makefile;
    values.super__Vector_base<cmList,_std::allocator<cmList>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    values.super__Vector_base<cmList,_std::allocator<cmList>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    values.super__Vector_base<cmList,_std::allocator<cmList>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    local_60 = inStatus;
    local_58 = (cmForEachFunctionBlocker *)functions;
    std::vector<cmList,_std::allocator<cmList>_>::reserve
              (&values,((long)(this->Args).
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_finish -
                        (long)(this->Args).
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start >> 5) - sVar1);
    pbVar3 = (this->Args).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    local_c0 = 0;
    for (psVar12 = (this->Args).
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start + this->IterationVarsCount;
        psVar12 != pbVar3; psVar12 = psVar12 + 1) {
      oldDefs._M_t._M_impl._0_8_ = 0;
      oldDefs._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
      oldDefs._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
      oldDefs._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
      psVar11 = cmMakefile::GetSafeDefinition(pcVar2,psVar12);
      if (psVar11->_M_string_length != 0) {
        cmList::assign((cmList *)&oldDefs,psVar11,Yes);
      }
      uVar6 = oldDefs._M_t._M_impl.super__Rb_tree_header._M_header._0_8_;
      uVar5 = oldDefs._M_t._M_impl._0_8_;
      std::vector<cmList,_std::allocator<cmList>_>::emplace_back<cmList>(&values,(cmList *)&oldDefs)
      ;
      uVar14 = (long)(uVar6 - uVar5) >> 5;
      if (local_c0 <= uVar14) {
        local_c0 = uVar14;
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&oldDefs);
    }
    iterationVars.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    iterationVars.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    iterationVars.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    __new_size = ((long)values.super__Vector_base<cmList,_std::allocator<cmList>_>._M_impl.
                        super__Vector_impl_data._M_finish -
                 (long)values.super__Vector_base<cmList,_std::allocator<cmList>_>._M_impl.
                       super__Vector_impl_data._M_start) / 0x18;
    if (this->IterationVarsCount < 2) {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::resize(&iterationVars,__new_size);
      std::operator+(&iter_var_prefix,
                     (this->Args).
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start,"_");
      pbVar3 = iterationVars.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      uVar18 = 0;
      for (pbVar16 = iterationVars.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start; pbVar16 != pbVar3;
          pbVar16 = pbVar16 + 1) {
        std::__cxx11::to_string((string *)&oldDefs,uVar18);
        std::operator+(&local_88,&iter_var_prefix,(string *)&oldDefs);
        std::__cxx11::string::~string((string *)&oldDefs);
        std::__cxx11::string::operator=((string *)pbVar16,(string *)&local_88);
        std::__cxx11::string::~string((string *)&local_88);
        uVar18 = uVar18 + 1;
      }
      std::__cxx11::string::~string((string *)&iter_var_prefix);
    }
    else {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::reserve(&iterationVars,__new_size);
      __first = (this->Args).
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      std::__copy_move<false,false,std::random_access_iterator_tag>::
      __copy_m<std::__cxx11::string*,std::back_insert_iterator<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
                (__first,__first + this->IterationVarsCount,&iterationVars);
    }
    if ((long)iterationVars.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish -
        (long)iterationVars.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start >> 5 !=
        ((long)values.super__Vector_base<cmList,_std::allocator<cmList>_>._M_impl.
               super__Vector_impl_data._M_finish -
        (long)values.super__Vector_base<cmList,_std::allocator<cmList>_>._M_impl.
              super__Vector_impl_data._M_start) / 0x18) {
      __assert_fail("\"Sanity check\" && iterationVars.size() == values.size()",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/cmForEachCommand.cxx"
                    ,0xc3,
                    "bool (anonymous namespace)::cmForEachFunctionBlocker::ReplayZipLists(const std::vector<cmListFileFunction> &, cmExecutionStatus &)"
                   );
    }
    oldDefs._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
         &oldDefs._M_t._M_impl.super__Rb_tree_header._M_header;
    oldDefs._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
         oldDefs._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ & 0xffffffff00000000;
    oldDefs._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    oldDefs._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
    uVar18 = 0;
    oldDefs._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
         oldDefs._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    while( true ) {
      uVar14 = ((long)values.super__Vector_base<cmList,_std::allocator<cmList>_>._M_impl.
                      super__Vector_impl_data._M_finish -
               (long)values.super__Vector_base<cmList,_std::allocator<cmList>_>._M_impl.
                     super__Vector_impl_data._M_start) / 0x18;
      if (uVar14 <= uVar18) break;
      psVar12 = iterationVars.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start + uVar18;
      PVar10 = cmMakefile::GetPolicyStatus(pcVar2,CMP0124,false);
      if (PVar10 == NEW) {
        bVar7 = cmMakefile::IsNormalDefinitionSet(pcVar2,psVar12);
        if (bVar7) {
          psVar11 = (string *)cmMakefile::GetDefinition(pcVar2,psVar12);
          if (psVar11 == (string *)0x0) {
            psVar11 = &cmValue::Empty_abi_cxx11_;
          }
          std::
          _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::optional<std::__cxx11::string>>,std::_Select1st<std::pair<std::__cxx11::string_const,std::optional<std::__cxx11::string>>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::optional<std::__cxx11::string>>>>
          ::_M_emplace_unique<std::__cxx11::string_const&,std::__cxx11::string_const&>
                    ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::optional<std::__cxx11::string>>,std::_Select1st<std::pair<std::__cxx11::string_const,std::optional<std::__cxx11::string>>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::optional<std::__cxx11::string>>>>
                      *)&oldDefs,psVar12,psVar11);
        }
        else {
          std::
          _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::optional<std::__cxx11::string>>,std::_Select1st<std::pair<std::__cxx11::string_const,std::optional<std::__cxx11::string>>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::optional<std::__cxx11::string>>>>
          ::_M_emplace_unique<std::__cxx11::string_const&,std::nullopt_t_const&>
                    ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::optional<std::__cxx11::string>>,std::_Select1st<std::pair<std::__cxx11::string_const,std::optional<std::__cxx11::string>>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::optional<std::__cxx11::string>>>>
                      *)&oldDefs,psVar12,(nullopt_t *)&std::nullopt);
        }
      }
      else {
        psVar11 = cmMakefile::GetSafeDefinition(pcVar2,psVar12);
        std::
        _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::optional<std::__cxx11::string>>,std::_Select1st<std::pair<std::__cxx11::string_const,std::optional<std::__cxx11::string>>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::optional<std::__cxx11::string>>>>
        ::_M_emplace_unique<std::__cxx11::string_const&,std::__cxx11::string_const&>
                  ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::optional<std::__cxx11::string>>,std::_Select1st<std::pair<std::__cxx11::string_const,std::optional<std::__cxx11::string>>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::optional<std::__cxx11::string>>>>
                    *)&oldDefs,psVar12,psVar11);
      }
      uVar18 = uVar18 + 1;
    }
    local_88._M_dataplus._M_p = (pointer)0x0;
    local_88._M_string_length = 0;
    local_88.field_2._M_allocated_capacity = 0;
    std::
    vector<__gnu_cxx::__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
    ::reserve((vector<__gnu_cxx::__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
               *)&local_88,uVar14);
    pcVar4 = values.super__Vector_base<cmList,_std::allocator<cmList>_>._M_impl.
             super__Vector_impl_data._M_finish;
    for (pcVar17 = values.super__Vector_base<cmList,_std::allocator<cmList>_>._M_impl.
                   super__Vector_impl_data._M_start; functions_00 = local_60, pcVar17 != pcVar4;
        pcVar17 = pcVar17 + 1) {
      iter_var_prefix._M_dataplus._M_p =
           (pointer)(pcVar17->Values).
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
      std::
      vector<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,std::allocator<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>>
      ::
      emplace_back<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
                ((vector<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,std::allocator<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>>
                  *)&local_88,
                 (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  *)&iter_var_prefix);
    }
    if ((long)(local_88._M_string_length - (long)local_88._M_dataplus._M_p) >> 3 !=
        ((long)values.super__Vector_base<cmList,_std::allocator<cmList>_>._M_impl.
               super__Vector_impl_data._M_finish -
        (long)values.super__Vector_base<cmList,_std::allocator<cmList>_>._M_impl.
              super__Vector_impl_data._M_start) / 0x18) {
      __assert_fail("\"Sanity check\" && positions.size() == values.size()",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/cmForEachCommand.cxx"
                    ,0xd9,
                    "bool (anonymous namespace)::cmForEachFunctionBlocker::ReplayZipLists(const std::vector<cmListFileFunction> &, cmExecutionStatus &)"
                   );
    }
    uVar14 = 0;
    IVar9.Restore = false;
    IVar9.Break = false;
    do {
      if (local_c0 <= uVar14) break;
      for (uVar18 = 0; uVar19 = (ulong)uVar18,
          uVar19 < (ulong)(((long)values.super__Vector_base<cmList,_std::allocator<cmList>_>._M_impl
                                  .super__Vector_impl_data._M_finish -
                           (long)values.super__Vector_base<cmList,_std::allocator<cmList>_>._M_impl.
                                 super__Vector_impl_data._M_start) / 0x18); uVar18 = uVar18 + 1) {
        pbVar3 = *(pointer *)(local_88._M_dataplus._M_p + uVar19 * 8);
        if (pbVar3 == values.super__Vector_base<cmList,_std::allocator<cmList>_>._M_impl.
                      super__Vector_impl_data._M_start[uVar19].Values.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish) {
          cmMakefile::RemoveDefinition
                    (pcVar2,iterationVars.
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start + uVar19);
        }
        else {
          value_01._M_str = (pbVar3->_M_dataplus)._M_p;
          value_01._M_len = pbVar3->_M_string_length;
          cmMakefile::AddDefinition
                    (pcVar2,iterationVars.
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start + uVar19,value_01);
          *(long *)(local_88._M_dataplus._M_p + uVar19 * 8) =
               *(long *)(local_88._M_dataplus._M_p + uVar19 * 8) + 0x20;
        }
      }
      IVar9 = invoke(local_58,(vector<cmListFileFunction,_std::allocator<cmListFileFunction>_> *)
                              functions_00,(cmExecutionStatus *)pcVar2,
                     (cmMakefile *)
                     values.super__Vector_base<cmList,_std::allocator<cmList>_>._M_impl.
                     super__Vector_impl_data._M_start);
      uVar14 = (ulong)((int)uVar14 + 1);
    } while ((ushort)IVar9 < 0x100);
    p_Var13 = oldDefs._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    if (((ushort)IVar9 & 1) != 0) {
      for (; (_Rb_tree_header *)p_Var13 != &oldDefs._M_t._M_impl.super__Rb_tree_header;
          p_Var13 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var13)) {
        if ((char)p_Var13[3]._M_color == _S_black) {
          value_02._M_str = *(char **)(p_Var13 + 2);
          value_02._M_len = (size_t)p_Var13[2]._M_parent;
          cmMakefile::AddDefinition(pcVar2,(string *)(p_Var13 + 1),value_02);
        }
        else {
          cmMakefile::RemoveDefinition(pcVar2,(string *)(p_Var13 + 1));
        }
      }
    }
    std::
    _Vector_base<__gnu_cxx::__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
    ::~_Vector_base((_Vector_base<__gnu_cxx::__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
                     *)&local_88);
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
    ::~_Rb_tree(&oldDefs._M_t);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&iterationVars);
    std::vector<cmList,_std::allocator<cmList>_>::~vector(&values);
  }
  else {
    if (sVar1 != 1) {
      __assert_fail("\"Unexpected number of iteration variables\" && this->IterationVarsCount == 1",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/cmForEachCommand.cxx"
                    ,0x71,
                    "bool (anonymous namespace)::cmForEachFunctionBlocker::ReplayItems(const std::vector<cmListFileFunction> &, cmExecutionStatus &)"
                   );
    }
    pcVar2 = inStatus->Makefile;
    oldDefs._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
         (_Base_ptr)
         ((ulong)oldDefs._M_t._M_impl.super__Rb_tree_header._M_header._M_right & 0xffffffffffffff00)
    ;
    PVar10 = cmMakefile::GetPolicyStatus(pcVar2,CMP0124,false);
    psVar12 = (this->Args).
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    if (PVar10 == NEW) {
      bVar7 = cmMakefile::IsNormalDefinitionSet(pcVar2,psVar12);
      if (bVar7) {
        psVar12 = (string *)
                  cmMakefile::GetDefinition
                            (pcVar2,(this->Args).
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start);
        if (psVar12 == (string *)0x0) {
          psVar12 = &cmValue::Empty_abi_cxx11_;
        }
        std::optional<std::__cxx11::string>::operator=
                  ((optional<std::__cxx11::string> *)&oldDefs,psVar12);
      }
    }
    else {
      psVar12 = cmMakefile::GetSafeDefinition(pcVar2,psVar12);
      std::optional<std::__cxx11::string>::operator=
                ((optional<std::__cxx11::string> *)&oldDefs,psVar12);
    }
    pbVar3 = (this->Args).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    IVar8.Restore = false;
    IVar8.Break = false;
    pbVar16 = (this->Args).
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    do {
      pbVar15 = pbVar16 + 1;
      if (pbVar15 == pbVar3) break;
      mf = (cmMakefile *)(pbVar15->_M_dataplus)._M_p;
      value._M_str = (char *)mf;
      value._M_len = pbVar16[1]._M_string_length;
      cmMakefile::AddDefinition
                (pcVar2,(this->Args).
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start,value);
      IVar8 = invoke((cmForEachFunctionBlocker *)functions,
                     (vector<cmListFileFunction,_std::allocator<cmListFileFunction>_> *)inStatus,
                     (cmExecutionStatus *)pcVar2,mf);
      pbVar16 = pbVar15;
    } while ((ushort)IVar8 < 0x100);
    if (((ushort)IVar8 & 1) != 0) {
      psVar12 = (this->Args).
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      if ((char)oldDefs._M_t._M_impl.super__Rb_tree_header._M_header._M_right == '\x01') {
        value_00._M_str = (char *)oldDefs._M_t._M_impl._0_8_;
        value_00._M_len = oldDefs._M_t._M_impl.super__Rb_tree_header._M_header._0_8_;
        cmMakefile::AddDefinition(pcVar2,psVar12,value_00);
      }
      else {
        cmMakefile::RemoveDefinition(pcVar2,psVar12);
      }
    }
    std::
    _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::_M_reset((_Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)&oldDefs);
  }
  return true;
}

Assistant:

bool cmForEachFunctionBlocker::Replay(
  std::vector<cmListFileFunction> functions, cmExecutionStatus& inStatus)
{
  return this->ZipLists ? this->ReplayZipLists(functions, inStatus)
                        : this->ReplayItems(functions, inStatus);
}